

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O3

int duckdb::NumericHelper::UnsignedLength<unsigned_int>(uint32_t value)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if (value < 10000) {
    iVar1 = 2 - (uint)(value < 10);
    uVar2 = 999;
    uVar3 = 99;
  }
  else {
    iVar1 = (((uint)(99999 < value) - (uint)(value < 1000000)) - (uint)(value < 10000000)) + 7;
    uVar2 = 999999999;
    uVar3 = 99999999;
  }
  return (uint)(uVar3 < value) + iVar1 + (uint)(uVar2 < value);
}

Assistant:

int NumericHelper::UnsignedLength(uint32_t value) {
	if (value >= 10000) {
		int length = 5;
		length += value >= 100000;
		length += value >= 1000000;
		length += value >= 10000000;
		length += value >= 100000000;
		length += value >= 1000000000;
		return length;
	} else {
		int length = 1;
		length += value >= 10;
		length += value >= 100;
		length += value >= 1000;
		return length;
	}
}